

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::compare(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  size_type sVar1;
  size_type sVar2;
  uint uVar3;
  uint src;
  uint uVar4;
  uint src_00;
  ulong uVar5;
  size_type __n;
  string Word2;
  string Word1;
  string local_70;
  string local_50;
  
  requireDStackDepth(this,4,"COMPARE");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src_00 = ForthStack<unsigned_int>::getTop(this_00);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  moveFromDataSpace(this,&local_50,src_00,(ulong)uVar4);
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  moveFromDataSpace(this,&local_70,src,(ulong)uVar3);
  sVar2 = local_50._M_string_length;
  sVar1 = local_70._M_string_length;
  __n = local_50._M_string_length;
  if (local_70._M_string_length < local_50._M_string_length) {
    __n = local_70._M_string_length;
  }
  if (__n == 0) {
    uVar5 = 0;
  }
  else {
    uVar3 = memcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,__n);
    uVar5 = (ulong)uVar3;
  }
  if ((int)uVar5 == 0) {
    uVar5 = 0xffffffff80000000;
    if (-0x80000000 < (long)(sVar2 - sVar1)) {
      uVar5 = sVar2 - sVar1;
    }
    if (0x7ffffffe < (long)uVar5) {
      uVar5 = 0x7fffffff;
    }
  }
  uVar3 = 0xffffffff;
  if (-1 < (int)uVar5) {
    uVar3 = (uint)((int)uVar5 != 0);
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compare(){
			REQUIRE_DSTACK_DEPTH(4, "COMPARE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); pop();
			auto length1 = dStack.getTop(); pop();
			auto caddr1 = CADDR(dStack.getTop()); 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{};
			moveFromDataSpace(Word2, caddr2, length2);
			auto result = Word1.compare(Word2);
			dStack.setTop((result < 0) ? -1 : ((result > 0) ? 1 : 0)); 
		}